

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_sv.c
# Opt level: O3

void * dtl_sv_to_ptr(dtl_sv_t *self)

{
  void *pvVar1;
  
  if (self != (dtl_sv_t *)0x0) {
    pvVar1 = (void *)0x0;
    switch(self->u32Flags >> 4 & 0xf) {
    case 1:
      return (void *)(long)(self->pAny->val).i32;
    case 2:
      return (void *)(ulong)(self->pAny->val).u32;
    case 9:
      return &self->pAny->val;
    case 10:
    case 0xb:
      pvVar1 = (void *)(self->pAny->val).i64;
    }
    return pvVar1;
  }
  return (void *)0x0;
}

Assistant:

void* dtl_sv_to_ptr(const dtl_sv_t *self){
   if(self){
      switch(dtl_sv_type(self)){
      case DTL_SV_NONE:
         break;
      case DTL_SV_I32:
#ifdef _WIN64
         return IntToPtr(self->pAny->val.i32);
#else
         return (void*) ((long) self->pAny->val.i32);
#endif
      case DTL_SV_U32:
#ifdef _WIN64
         return UIntToPtr(self->pAny->val.u32);
#else
         return (void*) ((unsigned long) self->pAny->val.u32);
#endif
      case DTL_SV_I64:
         break;
      case DTL_SV_U64:
         break;
      case DTL_SV_FLT:
         break;
      case DTL_SV_DBL:
         break;
      case DTL_SV_CHAR:
         break;
      case DTL_SV_BOOL:
         break;
      case DTL_SV_STR:
         return (void*) &self->pAny->val.str;
         break;
      case DTL_SV_PTR:
         return self->pAny->val.ptr.p;
         break;
      case DTL_SV_DV:
         return (void*) self->pAny->val.dv;
         break;
      case DTL_SV_BYTES:
         break;
      case DTL_SV_BYTEARRAY:
         break;
      }
   }
   return (void*)0;
}